

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_DEFAULTED_name(uint val,char **s_out)

{
  int iVar1;
  
  iVar1 = -1;
  if (val < 3) {
    *s_out = &DAT_001edd94 + *(int *)(&DAT_001edd94 + (ulong)val * 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_DEFAULTED_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_DEFAULTED_no:
        *s_out = "DW_DEFAULTED_no";
        return DW_DLV_OK;
    case DW_DEFAULTED_in_class:
        *s_out = "DW_DEFAULTED_in_class";
        return DW_DLV_OK;
    case DW_DEFAULTED_out_of_class:
        *s_out = "DW_DEFAULTED_out_of_class";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}